

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t *
Abc_NtkCollectCopies(Abc_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Bit_t *p_03;
  Vec_Bit_t *p_04;
  Gia_Obj_t *pGVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  char *pcVar6;
  bool bVar7;
  Vec_Bit_t *vPolar;
  Vec_Bit_t *vDriver;
  Vec_Ptr_t *vNodesR;
  Vec_Int_t *vNodes;
  Vec_Ptr_t *vObjs;
  Abc_Obj_t *pObj;
  int local_30;
  int iLit;
  int iObj;
  int i;
  Vec_Bit_t **pvPolar_local;
  Vec_Ptr_t **pvNodesR_local;
  Gia_Man_t *pGia_local;
  Abc_Ntk_t *p_local;
  
  p_00 = Abc_NtkDfs(p,0);
  iVar1 = Abc_NtkObjNumMax(p);
  p_01 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  p_02 = Vec_PtrStart(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  p_03 = Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  p_04 = Vec_BitStart(iVar1);
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCis);
    bVar7 = false;
    if (iLit < iVar1) {
      pGVar3 = Gia_ManCi(pGia,iLit);
      local_30 = Gia_ObjId(pGia,pGVar3);
      bVar7 = local_30 != 0;
    }
    if (!bVar7) break;
    pAVar4 = Abc_NtkCi(p,iLit);
    pcVar6 = Abc_ObjName(pAVar4);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    Vec_PtrWriteEntry(p_02,local_30,pcVar6);
    iLit = iLit + 1;
  }
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar7 = false;
    if (iLit < iVar1) {
      pGVar3 = Gia_ManCo(pGia,iLit);
      local_30 = Gia_ObjId(pGia,pGVar3);
      bVar7 = local_30 != 0;
    }
    if (!bVar7) break;
    pGVar3 = Gia_ManObj(pGia,local_30);
    iVar1 = Gia_ObjFaninId0(pGVar3,local_30);
    Vec_BitWriteEntry(p_03,iVar1,1);
    pAVar4 = Abc_NtkCo(p,iLit);
    pcVar6 = Abc_ObjName(pAVar4);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    Vec_PtrWriteEntry(p_02,local_30,pcVar6);
    Vec_IntPush(p_01,local_30);
    iLit = iLit + 1;
  }
  for (iLit = 0; iVar1 = Vec_PtrSize(p_00), iLit < iVar1; iLit = iLit + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iLit);
    iVar1 = (pAVar4->field_6).iTemp;
    if (-1 < iVar1) {
      iVar2 = Abc_Lit2Var(iVar1);
      pGVar3 = Gia_ManObj(pGia,iVar2);
      iVar2 = Gia_ObjIsAnd(pGVar3);
      if (iVar2 != 0) {
        iVar2 = Abc_Lit2Var(iVar1);
        iVar2 = Vec_BitEntry(p_03,iVar2);
        if (iVar2 == 0) {
          iVar2 = Abc_Lit2Var(iVar1);
          pvVar5 = Vec_PtrEntry(p_02,iVar2);
          if (pvVar5 == (void *)0x0) {
            iVar2 = Abc_Lit2Var(iVar1);
            pcVar6 = Abc_ObjName(pAVar4);
            pcVar6 = Abc_UtilStrsav(pcVar6);
            Vec_PtrWriteEntry(p_02,iVar2,pcVar6);
            iVar2 = Abc_Lit2Var(iVar1);
            Vec_IntPush(p_01,iVar2);
            iVar2 = Abc_Lit2Var(iVar1);
            iVar1 = Abc_LitIsCompl(iVar1);
            Vec_BitWriteEntry(p_04,iVar2,iVar1);
          }
        }
      }
    }
  }
  Vec_BitFree(p_03);
  Vec_PtrFree(p_00);
  Vec_IntSort(p_01,0);
  *pvNodesR = p_02;
  *pvPolar = p_04;
  return p_01;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCopies( Abc_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vObjs   = Abc_NtkDfs( p, 0 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Abc_NtkObjNumMax(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCi(p, i))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vObjs, pObj, i )
        if ( (iLit = pObj->iTemp) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Abc_ObjName(pObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_PtrFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}